

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexRuntime.cpp
# Opt level: O0

void __thiscall UnifiedRegex::ContStack::Print(ContStack *this,DebugWriter *w,Char *input)

{
  bool bVar1;
  size_t sVar2;
  Cont *pCVar3;
  undefined1 local_38 [8];
  Iterator it;
  Char *input_local;
  DebugWriter *w_local;
  ContStack *this_local;
  
  it.stack = (ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL> *)input;
  ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>::Iterator::Iterator
            ((Iterator *)local_38,
             &this->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>);
  while( true ) {
    bVar1 = ContinuousPageStack::Iterator::operator_cast_to_bool((Iterator *)local_38);
    if (!bVar1) break;
    sVar2 = ContinuousPageStack<1UL>::Iterator::Position((Iterator *)local_38);
    DebugWriter::Print(w,L"%4llu: ",sVar2);
    pCVar3 = ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>::Iterator::operator->
                       ((Iterator *)local_38);
    (**pCVar3->_vptr_Cont)(pCVar3,w,it.stack);
    ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>::Iterator::operator++
              ((Iterator *)local_38);
  }
  return;
}

Assistant:

void ContStack::Print(DebugWriter* w, const Char* const input) const
    {
        for (Iterator it(*this); it; ++it)
        {
            w->Print(_u("%4llu: "), static_cast<unsigned long long>(it.Position()));
            it->Print(w, input);
        }
    }